

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_messenger.cpp
# Opt level: O3

void __thiscall
cppcms::impl::messenger::transmit(messenger *this,tcp_operation_header *h,string *data)

{
  stream_socket *psVar1;
  pointer pcVar2;
  endpoint ep;
  vector<char,_std::allocator<char>_> d;
  mutable_buffer tmp;
  const_buffer packet;
  vector<char,_std::allocator<char>_> local_b0;
  buffer_impl<char_*> local_98;
  const_buffer local_68;
  string *local_38;
  
  psVar1 = &this->socket_;
  local_38 = &this->ip_;
  local_98.size_ = 0;
  local_98.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  booster::aio::buffer_impl<char_*>::add(&local_98,(char *)h,0x28);
  booster::aio::const_buffer::const_buffer(&local_68,(mutable_buffer *)&local_98);
  if (local_98.vec_.
      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.vec_.
                    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((ulong)h->size != 0) {
    local_98.size_ = 0;
    local_98.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<const_char_*>::add
              ((buffer_impl<const_char_*> *)&local_98,(data->_M_dataplus)._M_p,(ulong)h->size);
    booster::aio::details::add<booster::aio::const_buffer>(&local_68,(const_buffer *)&local_98);
    if (local_98.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  booster::aio::stream_socket::write((const_buffer *)psVar1);
  local_98.size_ = 0;
  local_98.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  booster::aio::buffer_impl<char_*>::add(&local_98,(char *)h,0x28);
  booster::aio::stream_socket::read((mutable_buffer *)psVar1);
  if (local_98.vec_.
      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.vec_.
                    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((ulong)h->size == 0) {
    data->_M_string_length = 0;
    *(data->_M_dataplus)._M_p = '\0';
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_b0,(ulong)h->size,(allocator_type *)&local_98);
    local_98.size_ = 0;
    local_98.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<char_*>::add
              (&local_98,
               local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    booster::aio::stream_socket::read((mutable_buffer *)psVar1);
    if (local_98.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    pcVar2 = (data->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)data,pcVar2,pcVar2 + data->_M_string_length,
               local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + h->size);
    if (local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_68.super_buffer_impl<const_char_*>.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super_buffer_impl<const_char_*>.vec_.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void messenger::transmit(tcp_operation_header &h,std::string &data)
{
	bool done=false;
	int times=0;
	do {
		try {
			booster::aio::const_buffer packet = booster::aio::buffer(&h,sizeof(h));
			if(h.size > 0)
				packet += booster::aio::buffer(data.c_str(),h.size);
				
			socket_.write(packet);
			socket_.read(booster::aio::buffer(&h,sizeof(h)));
			if(h.size>0) {
				std::vector<char> d(h.size);
				socket_.read(booster::aio::buffer(d));
				data.assign(d.begin(),d.begin()+h.size);
			}
			else {
				data.clear();
			}
			done=true;
		}
		catch(booster::system::system_error const &e) {
			if(times) {
				throw cppcms_error(std::string("tcp_cache:")+e.what());
			}
			socket_.close();
			booster::aio::endpoint ep(ip_,port_);
			booster::system::error_code er;
			socket_.open(ep.family(),er);
			if(!er)
				socket_.connect(ep,er);
			if(er) throw cppcms_error("reconnect:"+er.message());
			times++;
		}
	}while(!done);
}